

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

TrigramGenerator get_generator_for(IndexType type)

{
  runtime_error *this;
  undefined4 in_EDI;
  TrigramGenerator local_8;
  
  switch(in_EDI) {
  case 1:
    local_8 = gen_trigrams;
    break;
  case 2:
    local_8 = gen_b64grams;
    break;
  case 3:
    local_8 = gen_h4grams;
    break;
  case 4:
    local_8 = gen_wide_b64grams;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unhandled index type");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_8;
}

Assistant:

TrigramGenerator get_generator_for(IndexType type) {
    switch (type) {
        case IndexType::GRAM3:
            return gen_trigrams;
        case IndexType::TEXT4:
            return gen_b64grams;
        case IndexType::HASH4:
            return gen_h4grams;
        case IndexType::WIDE8:
            return gen_wide_b64grams;
    }

    throw std::runtime_error("unhandled index type");
}